

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O1

void A64SysRegMapper_toString(A64SysRegMapper *S,uint32_t Bits,char *result)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  _Bool isNeg;
  ulong uVar8;
  
  uVar8 = (ulong)Bits;
  lVar1 = 8;
  do {
    if (*(uint32_t *)((long)&SysRegPairs[0].Name + lVar1) == Bits) {
      pcVar2 = *(char **)((long)&insn_name_maps[0xff].name + lVar1);
      goto LAB_0026f3b3;
    }
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x2038);
  if (Bits == 0xff90) {
    builtin_strncpy(result,"cpm_ioacc_ctl_el3",0x12);
    return;
  }
  if (S->NumInstPairs != 0) {
    uVar7 = 1;
    uVar8 = 0;
    do {
      if (S->InstPairs[uVar8].Value == Bits) {
        pcVar2 = S->InstPairs[uVar8].Name;
LAB_0026f3b3:
        strcpy(result,pcVar2);
        return;
      }
      uVar8 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar8 < S->NumInstPairs);
  }
  isNeg = SUB81(uVar8,0);
  pcVar2 = utostr((ulong)(Bits >> 0xe & 3),isNeg);
  pcVar3 = utostr((ulong)(Bits >> 0xb & 7),isNeg);
  pcVar4 = utostr((ulong)(Bits >> 7 & 0xf),isNeg);
  pcVar5 = utostr((ulong)(Bits >> 3 & 0xf),isNeg);
  pcVar6 = utostr((ulong)(Bits & 7),isNeg);
  cs_snprintf(result,0x80,"s3_%s_c%s_c%s_%s",pcVar3,pcVar4,pcVar5,pcVar6);
  (*cs_mem_free)(pcVar2);
  (*cs_mem_free)(pcVar3);
  (*cs_mem_free)(pcVar4);
  (*cs_mem_free)(pcVar5);
  (*cs_mem_free)(pcVar6);
  return;
}

Assistant:

void A64SysRegMapper_toString(const A64SysRegMapper *S, uint32_t Bits, char *result)
{
	int dummy;
	uint32_t Op0, Op1, CRn, CRm, Op2;
	char *Op0S, *Op1S, *CRnS, *CRmS, *Op2S;
	unsigned i;

	// First search the registers shared by all
	for (i = 0; i < ARR_SIZE(SysRegPairs); ++i) {
		if (SysRegPairs[i].Value == Bits) {
			strcpy(result, SysRegPairs[i].Name);
			return;
		}
	}

	// Next search for target specific registers
	// if (FeatureBits & AArch64_ProcCyclone) {
	if (true) {
		for (i = 0; i < ARR_SIZE(CycloneSysRegPairs); ++i) {
			if (CycloneSysRegPairs[i].Value == Bits) {
				strcpy(result, CycloneSysRegPairs[i].Name);
				return;
			}
		}
	}

	// Now try the instruction-specific registers (either read-only or
	// write-only).
	for (i = 0; i < S->NumInstPairs; ++i) {
		if (S->InstPairs[i].Value == Bits) {
			strcpy(result, S->InstPairs[i].Name);
			return;
		}
	}

	Op0 = (Bits >> 14) & 0x3;
	Op1 = (Bits >> 11) & 0x7;
	CRn = (Bits >> 7) & 0xf;
	CRm = (Bits >> 3) & 0xf;
	Op2 = Bits & 0x7;

	Op0S = utostr(Op0, false);
	Op1S = utostr(Op1, false);
	CRnS = utostr(CRn, false);
	CRmS = utostr(CRm, false);
	Op2S = utostr(Op2, false);

	//printf("Op1S: %s, CRnS: %s, CRmS: %s, Op2S: %s\n", Op1S, CRnS, CRmS, Op2S);
	dummy = cs_snprintf(result, 128, "s3_%s_c%s_c%s_%s", Op1S, CRnS, CRmS, Op2S);
	(void)dummy;

	cs_mem_free(Op0S);
	cs_mem_free(Op1S);
	cs_mem_free(CRnS);
	cs_mem_free(CRmS);
	cs_mem_free(Op2S);
}